

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double libcellml::Units::scalingFactor(UnitsPtr *units1,UnitsPtr *units2,bool checkCompatibility)

{
  bool bVar1;
  __type_conflict1 _Var2;
  double local_30;
  double multiplier;
  bool updateUnits2;
  bool updateUnits1;
  UnitsPtr *pUStack_20;
  bool checkCompatibility_local;
  UnitsPtr *units2_local;
  UnitsPtr *units1_local;
  
  multiplier._7_1_ = checkCompatibility;
  pUStack_20 = units2;
  units2_local = units1;
  if ((!checkCompatibility) || (bVar1 = compatible(units1,units2), bVar1)) {
    multiplier._6_1_ = 0;
    multiplier._5_1_ = 0;
    bVar1 = std::operator!=(units2_local,(nullptr_t)0x0);
    if ((bVar1) && (bVar1 = std::operator!=(pUStack_20,(nullptr_t)0x0), bVar1)) {
      local_30 = 0.0;
      multiplier._6_1_ = updateUnitMultiplier(units2_local,-1,&local_30);
      multiplier._5_1_ = updateUnitMultiplier(pUStack_20,1,&local_30);
      if (((multiplier._6_1_ & 1) != 0) && ((bool)multiplier._5_1_)) {
        _Var2 = std::pow<int,double>(10,local_30);
        return _Var2;
      }
    }
  }
  return 0.0;
}

Assistant:

double Units::scalingFactor(const UnitsPtr &units1, const UnitsPtr &units2, bool checkCompatibility)
{
    if (checkCompatibility && !Units::compatible(units1, units2)) {
        return 0.0;
    }

    bool updateUnits1 = false;
    bool updateUnits2 = false;

    if ((units1 != nullptr) && (units2 != nullptr)) {
        double multiplier = 0.0;
        updateUnits1 = updateUnitMultiplier(units1, -1, multiplier);
        updateUnits2 = updateUnitMultiplier(units2, 1, multiplier);

        if (updateUnits1 && updateUnits2) {
            return std::pow(10, multiplier);
        }
    }

    return 0.0;
}